

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseTableTag(TidyDocImpl *doc,Node *table,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *pNStack_38;
  uint istackbase;
  Node *parent;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *table_local;
  TidyDocImpl *doc_local;
  
  pLVar2 = doc->lexer;
  prvTidyDeferDup(doc);
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
LAB_001464f9:
  while( true ) {
    while( true ) {
      do {
        parent = prvTidyGetToken(doc,IgnoreWhitespace);
        if (parent == (Node *)0x0) {
          prvTidyReport(doc,table,(Node *)0x0,600);
          pLVar2->istackbase = uVar1;
          return;
        }
        if (parent->tag == table->tag) {
          if (parent->type == EndTag) {
            prvTidyFreeNode(doc,parent);
          }
          else {
            prvTidyUngetToken(doc);
            prvTidyReport(doc,table,parent,0x27c);
          }
          pLVar2->istackbase = uVar1;
          table->closed = yes;
          return;
        }
        BVar3 = InsertMisc(table,parent);
      } while (BVar3 != no);
      if ((parent->tag != (Dict *)0x0) || (parent->type == TextNode)) break;
      prvTidyReport(doc,table,parent,0x233);
      prvTidyFreeNode(doc,parent);
    }
    if (parent->type == EndTag) break;
    if (((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_TD)) ||
        (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TH)
         ))) || (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) &&
                 (parent->tag->id == TidyTag_TABLE)))) {
      prvTidyUngetToken(doc);
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,table,parent,0x25f);
      break;
    }
    BVar3 = prvTidynodeIsText(parent);
    if ((BVar3 == no) && (BVar3 = prvTidynodeHasCM(parent,0x18), BVar3 == no)) {
      if ((parent->tag->model & 4) == 0) break;
      MoveToHead(doc,table,parent);
    }
    else {
      prvTidyInsertNodeBeforeElement(table,parent);
      prvTidyReport(doc,table,parent,0x27c);
      pLVar2->exiled = yes;
      if (parent->type != TextNode) {
        ParseTag(doc,parent,IgnoreWhitespace);
      }
      pLVar2->exiled = no;
    }
  }
  if (parent->type == EndTag) {
    if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
       (parent->tag->id == TidyTag_FORM)) {
      BadForm(doc);
      prvTidyReport(doc,table,parent,0x233);
      prvTidyFreeNode(doc,parent);
      goto LAB_001464f9;
    }
    BVar3 = prvTidynodeHasCM(parent,0x280);
    if ((BVar3 != no) || (BVar3 = prvTidynodeHasCM(parent,0x18), BVar3 != no)) {
      prvTidyReport(doc,table,parent,0x233);
      prvTidyFreeNode(doc,parent);
      goto LAB_001464f9;
    }
    for (pNStack_38 = table->parent; pNStack_38 != (Node *)0x0; pNStack_38 = pNStack_38->parent) {
      if (parent->tag == pNStack_38->tag) {
        prvTidyReport(doc,table,parent,599);
        prvTidyUngetToken(doc);
        pLVar2->istackbase = uVar1;
        return;
      }
    }
  }
  if ((parent->tag->model & 0x80) == 0) {
    prvTidyUngetToken(doc);
    prvTidyReport(doc,table,parent,0x27c);
    pLVar2->istackbase = uVar1;
    return;
  }
  BVar3 = prvTidynodeIsElement(parent);
  if (BVar3 == no) {
    prvTidyReport(doc,table,parent,0x233);
    prvTidyFreeNode(doc,parent);
  }
  else {
    prvTidyInsertNodeAtEnd(table,parent);
    ParseTag(doc,parent,IgnoreWhitespace);
  }
  goto LAB_001464f9;
}

Assistant:

void TY_(ParseTableTag)(TidyDocImpl* doc, Node *table, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_table = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
    uint istackbase;

    TY_(DeferDup)( doc );
    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_table++;
    SPRTF("Entering ParseTableTag %d...\n",in_parse_table);
#endif
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == table->tag )
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                /* Issue #498 - If a <table> in a <table>
                 * just close the current table, and issue a 
                 * warning. The previous action was to discard
                 * this second <table>
                 */
                TY_(UngetToken)(doc);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            }
            lexer->istackbase = istackbase;
            table->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_table--;
            SPRTF("Exit ParseTableTag 1 %d... EndTag\n",in_parse_table);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(table, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* if TD or TH or text or inline or block then infer <TR> */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) || nodeIsTABLE(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, table, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node) ||TY_(nodeHasCM)(node,CM_BLOCK|CM_INLINE) )
            {
                TY_(InsertNodeBeforeElement)(table, node);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode) 
                    ParseTag(doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, table, node);
                continue;
            }
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* best to discard unexpected block/inline end tags */
            if ( TY_(nodeHasCM)(node, CM_TABLE|CM_ROW) ||
                 TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = table->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, table, node, MISSING_ENDTAG_BEFORE );
                    TY_(UngetToken)( doc );
                    lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_table--;
                    SPRTF("Exit ParseTableTag 2 %d... missing EndTag\n",in_parse_table);
#endif
                    return;
                }
            }
        }

        if (!(node->tag->model & CM_TABLE))
        {
            TY_(UngetToken)( doc );
            TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_table--;
            SPRTF("Exit ParseTableTag 3 %d... CM_TABLE\n",in_parse_table);
#endif
            return;
        }

        if (TY_(nodeIsElement)(node))
        {
            TY_(InsertNodeAtEnd)(table, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, table, node, MISSING_ENDTAG_FOR);
    lexer->istackbase = istackbase;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_table--;
    SPRTF("Exit ParseTableTag 4 %d... missing end\n",in_parse_table);
#endif
}